

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_graph.cpp
# Opt level: O1

void __thiscall
test_adjacency_graph_clear_undirected_Test::~test_adjacency_graph_clear_undirected_Test
          (test_adjacency_graph_clear_undirected_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_adjacency_graph, clear_undirected) {
  Adjacency_Graph<false> graph({{0, 1}, {2, 1}, {2, 3}, {3, 0}});

  graph.clear();
  EXPECT_TRUE(graph.empty());
  EXPECT_EQ(graph.size_edge(), 0);
  EXPECT_EQ(graph.size_vertex(), 0);
  EXPECT_EQ(graph.capacity().first, std::make_pair(4, 4).first);    // make sure we have not lost capacity.
  EXPECT_EQ(graph.capacity().second, std::make_pair(4, 4).second);  // make sure we have not lost capacity.
}